

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
::try_emplace_impl_with_hash<phmap::priv::NonStandardLayout_const&>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
          *this,size_t hashval,NonStandardLayout *k)

{
  long lVar1;
  slot_type *psVar2;
  pointer pcVar3;
  ctrl_t *pcVar4;
  slot_type *psVar5;
  size_t sVar6;
  UniqueLock m;
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
  res;
  UniqueLock local_49;
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
  local_48;
  
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::find_or_prepare_insert_with_hash<phmap::priv::NonStandardLayout>
            (&local_48,
             (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              *)this,hashval,k,&local_49);
  if (local_48.
      super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
      .super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool>.
      super__Head_base<2UL,_bool,_false>._M_head_impl == true) {
    psVar2 = ((local_48.
               super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
               .
               super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_false>
              ._M_head_impl)->set_).slots_;
    psVar5 = psVar2 + local_48.
                      super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
                      .super__Tuple_impl<1UL,_unsigned_long,_bool>.
                      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    (psVar5->value).first._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_00344318;
    lVar1 = (long)psVar2 +
            local_48.
            super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
            .super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Head_base<1UL,_unsigned_long,_false>
            ._M_head_impl * 0x30 + 0x18;
    *(long *)(lVar1 + -0x10) = lVar1;
    pcVar3 = (k->value)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(psVar5->value).first.value,pcVar3,pcVar3 + (k->value)._M_string_length);
    *(undefined4 *)(lVar1 + 0x10) = 0;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
    ::set_ctrl(&(local_48.
                 super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
                 .
                 super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_false>
                ._M_head_impl)->set_,
               local_48.
               super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
               .super__Tuple_impl<1UL,_unsigned_long,_bool>.
               super__Head_base<1UL,_unsigned_long,_false>._M_head_impl,(byte)hashval & 0x7f);
  }
  pcVar4 = ((local_48.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
             .
             super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_false>
            ._M_head_impl)->set_).ctrl_;
  psVar5 = ((local_48.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
             .
             super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_false>
            ._M_head_impl)->set_).slots_;
  sVar6 = ((local_48.
            super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
            .
            super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_false>
           ._M_head_impl)->set_).capacity_;
  (__return_storage_ptr__->first).inner_ =
       local_48.
       super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
       .
       super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_false>
       ._M_head_impl;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x480);
  (__return_storage_ptr__->first).it_.ctrl_ =
       pcVar4 + local_48.
                super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
                .super__Tuple_impl<1UL,_unsigned_long,_bool>.
                super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
  (__return_storage_ptr__->first).it_.field_1.slot_ =
       psVar5 + local_48.
                super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
                .super__Tuple_impl<1UL,_unsigned_long,_bool>.
                super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar4 + sVar6;
  __return_storage_ptr__->second =
       (bool)local_48.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner_*,_unsigned_long,_bool>
             .super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool>.
             super__Head_base<2UL,_bool,_false>._M_head_impl;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl_with_hash(size_t hashval, K&& k, Args&&... args) {
        UniqueLock m;
        auto res = this->find_or_prepare_insert_with_hash(hashval, k, m);
        typename Base::Inner *inner = std::get<0>(res);
        if (std::get<2>(res)) {
            inner->set_.emplace_at(std::get<1>(res), std::piecewise_construct,
                                   std::forward_as_tuple(std::forward<K>(k)),
                                   std::forward_as_tuple(std::forward<Args>(args)...));
            inner->set_.set_ctrl(std::get<1>(res), H2(hashval));
        }
        return {this->iterator_at(inner, inner->set_.iterator_at(std::get<1>(res))), 
                std::get<2>(res)};
    }